

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

BOOL Js::JavascriptOperators::StrictEqualNumberType
               (Var aLeft,Var aRight,TypeId leftType,TypeId rightType,ScriptContext *requestContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  long lVar4;
  long lVar5;
  JavascriptTypedNumber<long> *pJVar6;
  JavascriptTypedNumber<unsigned_long> *pJVar7;
  unsigned_long uVar8;
  unsigned_long uVar9;
  undefined4 *puVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  unsigned_long rightValue_3;
  unsigned_long leftValue_3;
  long rightValue_2;
  unsigned_long leftValue_2;
  unsigned_long rightValue_1;
  long leftValue_1;
  long rightValue;
  long leftValue;
  double dblRight;
  double dblLeft;
  ScriptContext *requestContext_local;
  TypeId rightType_local;
  TypeId leftType_local;
  Var aRight_local;
  Var aLeft_local;
  
  switch(leftType) {
  case TypeIds_FirstNumberType:
    if (rightType == TypeIds_FirstNumberType) {
      return (uint)(aLeft == aRight);
    }
    if (rightType != TypeIds_Number) {
      return 0;
    }
    dblRight = TaggedInt::ToDouble(aLeft);
    leftValue = (long)JavascriptNumber::GetValue(aRight);
    break;
  case TypeIds_Number:
    switch(rightType) {
    case TypeIds_FirstNumberType:
      dblRight = JavascriptNumber::GetValue(aLeft);
      leftValue = (long)TaggedInt::ToDouble(aRight);
      break;
    case TypeIds_Number:
      dblRight = JavascriptNumber::GetValue(aLeft);
      leftValue = (long)JavascriptNumber::GetValue(aRight);
      break;
    case TypeIds_Int64Number:
      dblRight = JavascriptNumber::GetValue(aLeft);
      pJVar6 = VarTo<Js::JavascriptTypedNumber<long>>(aRight);
      lVar4 = JavascriptTypedNumber<long>::GetValue(pJVar6);
      leftValue = (long)(double)lVar4;
      break;
    case TypeIds_LastNumberType:
      dblRight = JavascriptNumber::GetValue(aLeft);
      pJVar7 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(aRight);
      uVar8 = JavascriptTypedNumber<unsigned_long>::GetValue(pJVar7);
      auVar12._8_4_ = (int)(uVar8 >> 0x20);
      auVar12._0_8_ = uVar8;
      auVar12._12_4_ = 0x45300000;
      leftValue = (long)((auVar12._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)uVar8) - 4503599627370496.0));
      break;
    default:
      return 0;
    }
    break;
  case TypeIds_Int64Number:
    if (rightType != TypeIds_Number) {
      if (rightType == TypeIds_Int64Number) {
        pJVar6 = UnsafeVarTo<Js::JavascriptTypedNumber<long>>(aLeft);
        lVar4 = JavascriptTypedNumber<long>::GetValue(pJVar6);
        pJVar6 = UnsafeVarTo<Js::JavascriptTypedNumber<long>>(aRight);
        lVar5 = JavascriptTypedNumber<long>::GetValue(pJVar6);
        return (uint)(lVar4 == lVar5);
      }
      if (rightType != TypeIds_LastNumberType) {
        return 0;
      }
      pJVar6 = UnsafeVarTo<Js::JavascriptTypedNumber<long>>(aLeft);
      uVar8 = JavascriptTypedNumber<long>::GetValue(pJVar6);
      pJVar7 = VarTo<Js::JavascriptTypedNumber<unsigned_long>>(aRight);
      uVar9 = JavascriptTypedNumber<unsigned_long>::GetValue(pJVar7);
      return (uint)(uVar8 == uVar9);
    }
    pJVar6 = UnsafeVarTo<Js::JavascriptTypedNumber<long>>(aLeft);
    lVar4 = JavascriptTypedNumber<long>::GetValue(pJVar6);
    dblRight = (double)lVar4;
    leftValue = (long)JavascriptNumber::GetValue(aRight);
    break;
  case TypeIds_LastNumberType:
    if (rightType != TypeIds_Number) {
      if (rightType == TypeIds_Int64Number) {
        pJVar7 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(aLeft);
        uVar8 = JavascriptTypedNumber<unsigned_long>::GetValue(pJVar7);
        pJVar6 = UnsafeVarTo<Js::JavascriptTypedNumber<long>>(aRight);
        uVar9 = JavascriptTypedNumber<long>::GetValue(pJVar6);
        return (uint)(uVar8 == uVar9);
      }
      if (rightType != TypeIds_LastNumberType) {
        return 0;
      }
      pJVar7 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(aLeft);
      uVar8 = JavascriptTypedNumber<unsigned_long>::GetValue(pJVar7);
      pJVar7 = VarTo<Js::JavascriptTypedNumber<unsigned_long>>(aRight);
      uVar9 = JavascriptTypedNumber<unsigned_long>::GetValue(pJVar7);
      return (uint)(uVar8 == uVar9);
    }
    pJVar7 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(aLeft);
    uVar8 = JavascriptTypedNumber<unsigned_long>::GetValue(pJVar7);
    auVar11._8_4_ = (int)(uVar8 >> 0x20);
    auVar11._0_8_ = uVar8;
    auVar11._12_4_ = 0x45300000;
    dblRight = (auVar11._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar8) - 4503599627370496.0);
    leftValue = (long)JavascriptNumber::GetValue(aRight);
    break;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x39e,"(0 && \"Unreachable Code\")","0 && \"Unreachable Code\"");
    if (bVar2) {
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 0;
      return 0;
    }
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  BVar3 = FEqualDbl(dblRight,(double)leftValue);
  return BVar3;
}

Assistant:

BOOL JavascriptOperators::StrictEqualNumberType(Var aLeft, Var aRight, TypeId leftType, TypeId rightType, ScriptContext *requestContext)
    {
        double dblLeft, dblRight;

        switch (leftType)
        {
        case TypeIds_Integer:
            switch (rightType)
            {
            case TypeIds_Integer:
                return aLeft == aRight;
                // we don't need to worry about int64: it cannot equal as we create
                // JavascriptInt64Number only in overflow scenarios.
            case TypeIds_Number:
                dblLeft = TaggedInt::ToDouble(aLeft);
                dblRight = JavascriptNumber::GetValue(aRight);
                goto CommonNumber;
            }
            return FALSE;

        case TypeIds_Int64Number:
            switch (rightType)
            {
            case TypeIds_Int64Number:
            {
                __int64 leftValue = UnsafeVarTo<JavascriptInt64Number>(aLeft)->GetValue();
                __int64 rightValue = UnsafeVarTo<JavascriptInt64Number>(aRight)->GetValue();
                return leftValue == rightValue;
            }
            case TypeIds_UInt64Number:
            {
                __int64 leftValue = UnsafeVarTo<JavascriptInt64Number>(aLeft)->GetValue();
                unsigned __int64 rightValue = VarTo<JavascriptUInt64Number>(aRight)->GetValue();
                return ((unsigned __int64)leftValue == rightValue);
            }
            case TypeIds_Number:
                dblLeft = (double)UnsafeVarTo<JavascriptInt64Number>(aLeft)->GetValue();
                dblRight = JavascriptNumber::GetValue(aRight);
                goto CommonNumber;
            }
            return FALSE;

        case TypeIds_UInt64Number:
            switch (rightType)
            {
            case TypeIds_Int64Number:
            {
                unsigned __int64 leftValue = UnsafeVarTo<JavascriptUInt64Number>(aLeft)->GetValue();
                __int64 rightValue = UnsafeVarTo<JavascriptInt64Number>(aRight)->GetValue();
                return (leftValue == (unsigned __int64)rightValue);
            }
            case TypeIds_UInt64Number:
            {
                unsigned __int64 leftValue = UnsafeVarTo<JavascriptUInt64Number>(aLeft)->GetValue();
                unsigned __int64 rightValue = VarTo<JavascriptUInt64Number>(aRight)->GetValue();
                return leftValue == rightValue;
            }
            case TypeIds_Number:
                dblLeft = (double)UnsafeVarTo<JavascriptUInt64Number>(aLeft)->GetValue();
                dblRight = JavascriptNumber::GetValue(aRight);
                goto CommonNumber;
            }
            return FALSE;

        case TypeIds_Number:
            switch (rightType)
            {
            case TypeIds_Integer:
                dblLeft = JavascriptNumber::GetValue(aLeft);
                dblRight = TaggedInt::ToDouble(aRight);
                goto CommonNumber;
            case TypeIds_Int64Number:
                dblLeft = JavascriptNumber::GetValue(aLeft);
                dblRight = (double)VarTo<JavascriptInt64Number>(aRight)->GetValue();
                goto CommonNumber;
            case TypeIds_UInt64Number:
                dblLeft = JavascriptNumber::GetValue(aLeft);
                dblRight = (double)UnsafeVarTo<JavascriptUInt64Number>(aRight)->GetValue();
                goto CommonNumber;
            case TypeIds_Number:
                dblLeft = JavascriptNumber::GetValue(aLeft);
                dblRight = JavascriptNumber::GetValue(aRight);
            CommonNumber:
                return FEqualDbl(dblLeft, dblRight);
            }
            return FALSE;
        }

        Assert(0 && "Unreachable Code");
        return FALSE;
    }